

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::args::SsboArgData::SsboArgData
          (SsboArgData *this,ArgMember *member_,string *data_)

{
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  this->member = *member_;
  std::__cxx11::string::_M_assign((string *)&this->data);
  return;
}

Assistant:

SsboArgData(const ArgMember& member_, const std::string& data_)
	{
		member	=	member_;
		data	=	data_;
	}